

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgmul(fitsfile *mfptr,int rmopt,int *status)

{
  int iVar1;
  char *__format;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  fitsfile *gfptr;
  int memberPosition;
  int iomode;
  long memberExtver;
  long local_9b8;
  int local_9ac;
  ulong local_9a8;
  long ngroups;
  char memberExtname [71];
  char memberHDUtype [71];
  char card [81];
  char keyword [75];
  char mbrLocation2 [1025];
  char mbrLocation1 [1025];
  
  memberPosition = 0;
  ngroups = 0;
  memberExtver = 0;
  gfptr = (fitsfile *)0x0;
  iVar1 = *status;
  if (iVar1 == 0) {
    iVar1 = ffgkys(mfptr,"XTENSION",memberHDUtype,card,status);
    *status = iVar1;
    if (iVar1 == 0xca) {
      builtin_strncpy(memberHDUtype,"PRIMARY",8);
      *status = 0;
    }
    prepare_keyvalue(memberHDUtype);
    iVar1 = ffgkyj(mfptr,"EXTVER",&memberExtver,card,status);
    *status = iVar1;
    if (iVar1 == 0xca) {
      memberExtver = 1;
      *status = 0;
    }
    local_9ac = rmopt;
    iVar1 = ffgkys(mfptr,"EXTNAME",memberExtname,card,status);
    *status = iVar1;
    if (iVar1 == 0xca) {
      memberExtname[0] = '\0';
      *status = 0;
    }
    prepare_keyvalue(memberExtname);
    ffghdn(mfptr,&memberPosition);
    iVar1 = fits_get_url(mfptr,mbrLocation1,mbrLocation2,(char *)0x0,(char *)0x0,(int *)0x0,status);
    *status = iVar1;
    if (iVar1 == 0) {
      iVar1 = ffgmng(mfptr,&ngroups,status);
      *status = iVar1;
      uVar3 = ngroups;
      if (ngroups < 1) {
        uVar3 = 0;
      }
      uVar2 = 0;
      while (uVar3 != uVar2) {
        if (iVar1 != 0) goto LAB_001ae31b;
        uVar2 = uVar2 + 1;
        iVar1 = ffgtop(mfptr,(int)uVar2,&gfptr,status);
        *status = iVar1;
        if (iVar1 == 0) {
          ffflmd(gfptr,&iomode,status);
          if (iomode != 1) {
            __format = "The %dth group cannot be modified (ffgtam)";
            goto LAB_001ae414;
          }
          local_9b8 = 0;
          if (mbrLocation1[0] == '\0') {
            iVar1 = *status;
          }
          else {
            iVar1 = ffgmf(gfptr,memberHDUtype,memberExtname,(int)memberExtver,memberPosition,
                          mbrLocation1,&local_9b8,status);
            *status = iVar1;
          }
          if ((iVar1 == 0x156) && (mbrLocation2[0] != '\0')) {
            *status = 0;
            iVar1 = ffgmf(gfptr,memberHDUtype,memberExtname,(int)memberExtver,memberPosition,
                          mbrLocation2,&local_9b8,status);
            *status = iVar1;
          }
          if (iVar1 == 0) {
            iVar1 = ffdrow(gfptr,local_9b8,1,status);
            *status = iVar1;
          }
          if (iVar1 == 0x156) {
            ffpmsg("cannot locate member\'s entry in group table (ffgmul)");
          }
          *status = 0;
          if (gfptr != (fitsfile *)0x0) {
            ffclos(gfptr,status);
            gfptr = (fitsfile *)0x0;
          }
        }
        else {
          *status = 0;
          __format = "Cannot open the %dth group table (ffgmul)";
LAB_001ae414:
          snprintf(card,0x51,__format,uVar2 & 0xffffffff);
          ffpmsg(card);
        }
        iVar1 = *status;
      }
      if (local_9ac != 0 && iVar1 == 0) {
        ffflmd(mfptr,&iomode,status);
        if (iomode == 0) {
          ffpmsg("Cannot modify member HDU, opened READONLY (ffgmul)");
        }
        else {
          uVar2 = 0;
          local_9a8 = uVar3;
          while ((local_9a8 != uVar2 && (*status == 0))) {
            uVar4 = (int)uVar2 + 1;
            snprintf(keyword,0x4b,"GRPID%d",(ulong)uVar4);
            ffdkey(mfptr,keyword,status);
            snprintf(keyword,0x4b,"GRPLC%d",(ulong)uVar4);
            ffdkey(mfptr,keyword,status);
            if (*status == 0xca) {
              *status = 0;
            }
            uVar2 = uVar2 + 1;
          }
        }
      }
    }
LAB_001ae31b:
    if (gfptr != (fitsfile *)0x0) {
      ffclos(gfptr,status);
    }
    iVar1 = *status;
  }
  return iVar1;
}

Assistant:

int ffgmul(fitsfile *mfptr,   /* pointer to the grouping table member HDU    */
           int       rmopt,   /* 0 ==> leave GRPIDn/GRPLCn keywords,
				 1 ==> remove GRPIDn/GRPLCn keywords         */
	   int      *status) /* return status code                          */

/*
   examine all the GRPIDn and GRPLCn keywords in the member HDUs header
   and remove the member from the grouping tables referenced; This
   effectively "unlinks" the member from all of its groups. The rmopt 
   specifies if the GRPIDn/GRPLCn keywords are to be removed from the
   member HDUs header after the unlinking.
*/

{
  int memberPosition = 0;
  int iomode;

  long index;
  long ngroups      = 0;
  long memberExtver = 0;
  long memberID     = 0;

  char mbrLocation1[FLEN_FILENAME];
  char mbrLocation2[FLEN_FILENAME];
  char memberHDUtype[FLEN_VALUE];
  char memberExtname[FLEN_VALUE];
  char keyword[FLEN_KEYWORD];
  char card[FLEN_CARD];

  fitsfile *gfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      /* 
	 determine location parameters of the member HDU; note that
	 default values are supplied if the expected keywords are not
	 found
      */

      *status = fits_read_key_str(mfptr,"XTENSION",memberHDUtype,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  strcpy(memberHDUtype,"PRIMARY");
	  *status = 0;
	}
      prepare_keyvalue(memberHDUtype);

      *status = fits_read_key_lng(mfptr,"EXTVER",&memberExtver,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtver = 1;
	  *status      = 0;
	}

      *status = fits_read_key_str(mfptr,"EXTNAME",memberExtname,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtname[0] = 0;
	  *status          = 0;
	}
      prepare_keyvalue(memberExtname);

      fits_get_hdu_num(mfptr,&memberPosition);

      *status = fits_get_url(mfptr,mbrLocation1,mbrLocation2,NULL,NULL,
			     NULL,status);

      if(*status != 0) continue;

      /*
	 open each grouping table linked to this HDU and remove the member 
	 from the grouping tables
      */

      *status = fits_get_num_groups(mfptr,&ngroups,status);

      /* loop over each group linked to the member HDU */

      for(index = 1; index <= ngroups && *status == 0; ++index)
	{
	  /* open the (index)th group linked to the member HDU */ 

	  *status = fits_open_group(mfptr,index,&gfptr,status);

	  /* if the group could not be opened then just skip it */

	  if(*status != 0)
	    {
	      *status = 0;
	      snprintf(card,FLEN_CARD,"Cannot open the %dth group table (ffgmul)",
		      (int)index);
	      ffpmsg(card);
	      continue;
	    }

	  /*
	    make sure the grouping table can be modified before proceeding
	  */
	  
	  fits_file_mode(gfptr,&iomode,status);

	  if(iomode != READWRITE)
	    {
	      snprintf(card,FLEN_CARD,"The %dth group cannot be modified (ffgtam)",
		      (int)index);
	      ffpmsg(card);
	      continue;
	    }

	  /* 
	     try to find the member's row within the grouping table; first 
	     try using the member HDU file's "real" URL string then try
	     using its originally opened URL string if either string exist
	   */
	     
	  memberID = 0;
 
	  if(strlen(mbrLocation1) != 0)
	    {
	      *status = ffgmf(gfptr,memberHDUtype,memberExtname,memberExtver,
			      memberPosition,mbrLocation1,&memberID,status);
	    }

	  if(*status == MEMBER_NOT_FOUND && strlen(mbrLocation2) != 0)
	    {
	      *status = 0;
	      *status = ffgmf(gfptr,memberHDUtype,memberExtname,memberExtver,
			      memberPosition,mbrLocation2,&memberID,status);
	    }

	  /* if the member was found then delete it from the grouping table */

	  if(*status == 0)
	    *status = fits_delete_rows(gfptr,memberID,1,status);

	  /*
	     continue the loop over all member groups even if an error
	     was generated
	  */

	  if(*status == MEMBER_NOT_FOUND)
	    {
	      ffpmsg("cannot locate member's entry in group table (ffgmul)");
	    }
	  *status = 0;

	  /*
	     close the file pointed to by gfptr if it is non NULL to
	     prepare for the next loop iterration
	  */

	  if(gfptr != NULL)
	    {
	      fits_close_file(gfptr,status);
	      gfptr = NULL;
	    }
	}

      if(*status != 0) continue;

      /*
	 if rmopt is non-zero then find and delete the GRPIDn/GRPLCn 
	 keywords from the member HDU header
      */

      if(rmopt != 0)
	{
	  fits_file_mode(mfptr,&iomode,status);

	  if(iomode == READONLY)
	    {
	      ffpmsg("Cannot modify member HDU, opened READONLY (ffgmul)");
	      continue;
	    }

	  /* delete all the GRPIDn/GRPLCn keywords */

	  for(index = 1; index <= ngroups && *status == 0; ++index)
	    {
	      snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)index);
	      fits_delete_key(mfptr,keyword,status);
	      
	      snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)index);
	      fits_delete_key(mfptr,keyword,status);

	      if(*status == KEY_NO_EXIST) *status = 0;
	    }
	}
    }while(0);

  /* make sure the gfptr has been closed */

  if(gfptr != NULL)
    { 
      fits_close_file(gfptr,status);
    }

return(*status);
}